

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_one_line_comment
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  char_t ch;
  undefined1 local_21;
  undefined4 in_stack_ffffffffffffffe8;
  char_t in_stack_ffffffffffffffec;
  undefined2 in_stack_ffffffffffffffee;
  
  bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end
                    ((input_stream_t<cfgfile::qstring_trait_t> *)
                     CONCAT26(in_stack_ffffffffffffffee,
                              CONCAT24(in_stack_ffffffffffffffec.ucs,in_stack_ffffffffffffffe8)));
  if (!bVar1) {
    input_stream_t<cfgfile::qstring_trait_t>::get
              ((input_stream_t<cfgfile::qstring_trait_t> *)
               CONCAT26(in_stack_ffffffffffffffee,
                        CONCAT24(in_stack_ffffffffffffffec.ucs,in_stack_ffffffffffffffe8)));
    while( true ) {
      bVar1 = ::operator!=((QChar)0x0,(QChar)0x0);
      local_21 = 0;
      if (bVar1) {
        in_stack_ffffffffffffffee = const_t<cfgfile::qstring_trait_t>::c_line_feed;
        bVar1 = ::operator!=((QChar)0x0,(QChar)0x0);
        local_21 = 0;
        if (bVar1) {
          bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end
                            ((input_stream_t<cfgfile::qstring_trait_t> *)
                             CONCAT26(in_stack_ffffffffffffffee,
                                      CONCAT24(in_stack_ffffffffffffffec.ucs,
                                               in_stack_ffffffffffffffe8)));
          local_21 = bVar1 ^ 0xff;
        }
      }
      if ((local_21 & 1) == 0) break;
      in_stack_ffffffffffffffec =
           input_stream_t<cfgfile::qstring_trait_t>::get
                     ((input_stream_t<cfgfile::qstring_trait_t> *)
                      CONCAT26(in_stack_ffffffffffffffee,
                               CONCAT24(in_stack_ffffffffffffffec.ucs,in_stack_ffffffffffffffe8)));
    }
  }
  return;
}

Assistant:

void skip_one_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			while( ch != const_t< Trait >::c_carriage_return &&
				ch != const_t< Trait >::c_line_feed &&
				!m_stream.at_end() )
					ch = m_stream.get();
		}
	}